

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<unsigned_char,unsigned_int>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,uchar *t_lhs,uchar *c_lhs,uint *c_rhs)

{
  byte bVar1;
  uchar uVar2;
  undefined8 *puVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  bool b;
  Boxed_Value BVar5;
  
  switch(t_oper) {
  case equals:
    b = *c_rhs == (uint)*c_lhs;
    goto LAB_003a93c6;
  case less_than:
    b = (uint)*c_lhs < *c_rhs;
    goto LAB_003a93c6;
  case greater_than:
    b = *c_rhs < (uint)*c_lhs;
    goto LAB_003a93c6;
  case less_than_equal:
    b = (uint)*c_lhs <= *c_rhs;
    goto LAB_003a93c6;
  case greater_than_equal:
    b = *c_rhs <= (uint)*c_lhs;
    goto LAB_003a93c6;
  case not_equal:
    b = *c_rhs != (uint)*c_lhs;
LAB_003a93c6:
    BVar5 = const_var((chaiscript *)this,b);
    _Var4._M_pi = BVar5.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    goto LAB_003a93e7;
  default:
    if (t_lhs == (uchar *)0x0) {
switchD_003a9436_caseD_7:
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = &PTR__bad_cast_004a2090;
      __cxa_throw(puVar3,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    switch(t_oper) {
    case assign:
      uVar2 = (uchar)*c_rhs;
      goto LAB_003a94b0;
    default:
      goto switchD_003a9436_caseD_7;
    case assign_product:
      uVar2 = *t_lhs * (char)*c_rhs;
LAB_003a94b0:
      *t_lhs = uVar2;
      break;
    case assign_sum:
      *t_lhs = *t_lhs + (char)*c_rhs;
      break;
    case assign_quotient:
      check_divide_by_zero<unsigned_int>(*c_rhs);
      bVar1 = (byte)((uint)*t_lhs / *c_rhs);
      goto LAB_003a94a3;
    case assign_difference:
      *t_lhs = *t_lhs - (char)*c_rhs;
      break;
    case assign_bitwise_and:
      check_divide_by_zero<unsigned_int>(*c_rhs);
      *t_lhs = *t_lhs & (byte)*c_rhs;
      break;
    case assign_bitwise_or:
      *t_lhs = *t_lhs | (byte)*c_rhs;
      break;
    case assign_shift_left:
      bVar1 = *t_lhs << ((byte)*c_rhs & 0x1f);
      goto LAB_003a94a3;
    case assign_shift_right:
      bVar1 = *t_lhs >> ((byte)*c_rhs & 0x1f);
LAB_003a94a3:
      *t_lhs = bVar1;
      break;
    case assign_remainder:
      *t_lhs = (uchar)((uint)*t_lhs % *c_rhs);
      break;
    case assign_bitwise_xor:
      *t_lhs = *t_lhs ^ (byte)*c_rhs;
    }
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)t_bv);
    _Var4._M_pi = extraout_RDX;
    goto LAB_003a93e7;
  case shift_left:
    goto LAB_003a9382;
  case shift_right:
LAB_003a9382:
    BVar5 = detail::const_var_impl<int>((int *)this);
    _Var4._M_pi = BVar5.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    goto LAB_003a93e7;
  case remainder:
    check_divide_by_zero<unsigned_int>(*c_rhs);
    break;
  case bitwise_and:
    break;
  case bitwise_or:
    break;
  case bitwise_xor:
    break;
  case sum:
    break;
  case quotient:
    check_divide_by_zero<unsigned_int>(*c_rhs);
    break;
  case product:
    break;
  case difference:
  }
  BVar5 = detail::const_var_impl<unsigned_int>((uint *)this);
  _Var4._M_pi = BVar5.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
LAB_003a93e7:
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }